

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_CCtx_trace(ZSTD_CCtx *cctx,size_t extraCSize)

{
  undefined4 local_48;
  uint local_44;
  ulong local_40;
  size_t sStack_38;
  unsigned_long_long local_30;
  long lStack_28;
  ZSTD_CCtx_params *local_20;
  ZSTD_CCtx *pZStack_18;
  undefined8 local_10;
  
  if (cctx->traceCtx != 0) {
    local_44 = 1;
    if ((cctx->inBuffSize == 0) && (cctx->outBuffSize == 0)) {
      local_44 = (uint)(0 < (cctx->appliedParams).nbWorkers);
    }
    local_10 = 0;
    local_48 = 0x2904;
    local_40 = (ulong)cctx->dictID;
    sStack_38 = cctx->dictContentSize;
    local_30 = cctx->consumedSrcSize;
    lStack_28 = extraCSize + cctx->producedCSize;
    local_20 = &cctx->appliedParams;
    pZStack_18 = cctx;
    ZSTD_trace_compress_end(cctx->traceCtx,&local_48);
  }
  cctx->traceCtx = 0;
  return;
}

Assistant:

void ZSTD_CCtx_trace(ZSTD_CCtx* cctx, size_t extraCSize)
{
#if ZSTD_TRACE
    if (cctx->traceCtx && ZSTD_trace_compress_end != NULL) {
        int const streaming = cctx->inBuffSize > 0 || cctx->outBuffSize > 0 || cctx->appliedParams.nbWorkers > 0;
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        trace.dictionaryID = cctx->dictID;
        trace.dictionarySize = cctx->dictContentSize;
        trace.uncompressedSize = cctx->consumedSrcSize;
        trace.compressedSize = cctx->producedCSize + extraCSize;
        trace.params = &cctx->appliedParams;
        trace.cctx = cctx;
        ZSTD_trace_compress_end(cctx->traceCtx, &trace);
    }
    cctx->traceCtx = 0;
#else
    (void)cctx;
    (void)extraCSize;
#endif
}